

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

Arguments * __thiscall
Corrade::Utility::Arguments::addSkippedPrefix(Arguments *this,string *prefix,string *help)

{
  size_t sVar1;
  Entry *pEVar2;
  ulong __n;
  bool bVar3;
  int iVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ostream *poVar5;
  Debug *pDVar6;
  size_t __len;
  long lVar7;
  Error local_58;
  
  bVar3 = skippedPrefix(this,prefix);
  if (bVar3) {
    poVar5 = Error::defaultOutput();
    Error::Error(&local_58,poVar5,(Flags)0x0);
    pDVar6 = Debug::operator<<(&local_58.super_Debug,
                               "Utility::Arguments::addSkippedPrefix(): prefix");
    pDVar6 = Implementation::debugPrintStlString(pDVar6,prefix);
    Debug::operator<<(pDVar6,"already added");
LAB_0010c075:
    Error::~Error(&local_58);
    abort();
  }
  sVar1 = (this->_entries)._size;
  if (sVar1 != 0) {
    pEVar2 = (this->_entries)._data;
    __n = prefix->_M_string_length;
    lVar7 = 0;
    do {
      if (__n <= *(ulong *)((long)&(pEVar2->key)._M_string_length + lVar7)) {
        if (__n != 0) {
          iVar4 = bcmp((prefix->_M_dataplus)._M_p,
                       *(void **)((long)&(pEVar2->key)._M_dataplus._M_p + lVar7),__n);
          if (iVar4 != 0) goto LAB_0010bfe9;
        }
        poVar5 = Error::defaultOutput();
        Error::Error(&local_58,poVar5,(Flags)0x0);
        pDVar6 = Debug::operator<<(&local_58.super_Debug,
                                   "Utility::Arguments::addSkippedPrefix(): skipped prefix");
        pDVar6 = Implementation::debugPrintStlString(pDVar6,prefix);
        Debug::operator<<(pDVar6,"conflicts with existing keys");
        goto LAB_0010c075;
      }
LAB_0010bfe9:
      lVar7 = lVar7 + 0xb0;
    } while (sVar1 * 0xb0 - lVar7 != 0);
  }
  std::__cxx11::string::push_back((char)prefix);
  this_00 = Containers::Implementation::
            arrayGrowBy<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      (&this->_skippedPrefixes,1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this_00,prefix,help);
  return this;
}

Assistant:

Arguments& Arguments::addSkippedPrefix(std::string prefix, std::string help) {
    CORRADE_ASSERT(!skippedPrefix(prefix),
        "Utility::Arguments::addSkippedPrefix(): prefix" << prefix << "already added", *this);

    /* Verify that no already added option conflicts with this */
    #ifndef CORRADE_NO_ASSERT
    for(const Entry& entry: _entries)
        CORRADE_ASSERT(!keyHasPrefix(entry.key, prefix),
            "Utility::Arguments::addSkippedPrefix(): skipped prefix" << prefix << "conflicts with existing keys", *this);
    #endif

    /* Add `-` to the end so we always compare with `--prefix-` and not just
       `--prefix` */
    prefix += '-';

    arrayAppend(_skippedPrefixes, InPlaceInit, std::move(prefix), std::move(help));
    return *this;
}